

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

bool __thiscall
iDynTree::Model::updateInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  SpatialInertia *pSVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Vector10 inertiaParamsBuf;
  
  lVar3 = iDynTree::VectorDynSize::size();
  pLVar1 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_start;
  pLVar2 = (this->links).super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>._M_impl
           .super__Vector_impl_data._M_finish;
  lVar6 = ((long)pLVar2 - (long)pLVar1 >> 4) * 0x4924924924924926;
  if (lVar3 == lVar6) {
    if (pLVar2 != pLVar1) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        iDynTree::VectorDynSize::data();
        iDynTree::VectorDynSize::size();
        pSVar4 = Link::inertia((Link *)((long)(((this->links).
                                                super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              m_inertia).m_mcom + lVar5 + 0xfffffffffffffff0U));
        iDynTree::SpatialInertia::fromVector((VectorFixSize *)pSVar4);
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x70;
      } while (uVar7 < (ulong)(((long)(this->links).
                                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->links).
                                      super__Vector_base<iDynTree::Link,_std::allocator<iDynTree::Link>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4) *
                              0x6db6db6db6db6db7));
    }
  }
  else {
    iDynTree::reportError
              ("Model","updateInertialParameters",
               "modelInertialParams has the wrong number of parameters");
  }
  return lVar3 == lVar6;
}

Assistant:

bool Model::updateInertialParameters(const VectorDynSize& modelInertialParams)
{
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        reportError("Model","updateInertialParameters","modelInertialParams has the wrong number of parameters");
        return false;
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf;
        toEigen(inertiaParamsBuf) = toEigen(modelInertialParams).segment<10>(10*linkIdx);

        links[linkIdx].inertia().fromVector(inertiaParamsBuf);
    }

    return true;
}